

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-donna-impl-base.h
# Opt level: O2

void ge25519_scalarmult_base_niels
               (ge25519 *r,uint8_t (*basepoint_table) [96],bignum256modm_element_t *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  byte *pbVar30;
  byte bVar31;
  char b_00;
  long lVar32;
  uint64_t uVar33;
  byte b_01;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  undefined8 local_f0;
  char b [64];
  ge25519_niels t;
  
  pbVar30 = (byte *)b;
  for (lVar32 = 0; lVar32 != 5; lVar32 = lVar32 + 1) {
    uVar35 = *(ulong *)(*basepoint_table + lVar32 * 8);
    lVar36 = 0xe;
    if (lVar32 == 4) {
      lVar36 = 8;
    }
    while (bVar40 = lVar36 != 0, lVar36 = lVar36 + -1, bVar40) {
      *pbVar30 = (byte)uVar35 & 0xf;
      pbVar30 = pbVar30 + 1;
      uVar35 = uVar35 >> 4;
    }
  }
  b_01 = 0;
  for (lVar32 = 1; lVar32 != 0x40; lVar32 = lVar32 + 1) {
    b[lVar32] = b[lVar32] + ((char)(b_01 + b[lVar32 + -1]) >> 4);
    bVar31 = b_01 + b[lVar32 + -1] & 0xf;
    b_01 = bVar31 >> 3;
    b[lVar32 + -1] = bVar31 + b_01 * -0x10;
  }
  b[0x3f] = b[0x3f] + b_01;
  ge25519_scalarmult_base_choose_niels(&t,(uint8_t (*) [96])0x0,(int)b[1],b_01);
  uVar37 = (t.xaddy[0] - t.ysubx[0]) + 0x1fffffffffffb4;
  uVar35 = ((uVar37 >> 0x33) + t.xaddy[1] + 0x1ffffffffffffc) - t.ysubx[1];
  r->x[1] = uVar35 & 0x7ffffffffffff;
  uVar35 = ((t.xaddy[2] + 0x1ffffffffffffc) - t.ysubx[2]) + (uVar35 >> 0x33);
  r->x[2] = uVar35 & 0x7ffffffffffff;
  uVar35 = ((t.xaddy[3] + 0x1ffffffffffffc) - t.ysubx[3]) + (uVar35 >> 0x33);
  r->x[3] = uVar35 & 0x7ffffffffffff;
  uVar35 = ((t.xaddy[4] + 0x1ffffffffffffc) - t.ysubx[4]) + (uVar35 >> 0x33);
  r->x[4] = uVar35 & 0x7ffffffffffff;
  r->x[0] = (uVar35 >> 0x33) * 0x13 + (uVar37 & 0x7ffffffffffff);
  uVar35 = t.xaddy[1] + t.ysubx[1] + (t.ysubx[0] + t.xaddy[0] >> 0x33);
  r->y[1] = uVar35 & 0x7ffffffffffff;
  uVar35 = t.ysubx[2] + t.xaddy[2] + (uVar35 >> 0x33);
  r->y[2] = uVar35 & 0x7ffffffffffff;
  uVar35 = t.ysubx[3] + t.xaddy[3] + (uVar35 >> 0x33);
  r->y[3] = uVar35 & 0x7ffffffffffff;
  uVar35 = t.ysubx[4] + t.xaddy[4] + (uVar35 >> 0x33);
  r->y[4] = uVar35 & 0x7ffffffffffff;
  uVar33 = (uVar35 >> 0x33) * 0x13 + (t.ysubx[0] + t.xaddy[0] & 0x7ffffffffffff);
  r->y[0] = uVar33;
  r->z[1] = 0;
  r->z[2] = 0;
  r->z[3] = 0;
  r->z[4] = 0;
  r->t[0] = t.t2d[0];
  r->t[1] = t.t2d[1];
  r->t[2] = t.t2d[2];
  r->t[3] = t.t2d[3];
  r->t[4] = t.t2d[4];
  r->z[0] = 2;
  uVar34 = 1;
  for (uVar35 = 3; b_00 = (char)uVar33, uVar35 < 0x40; uVar35 = uVar35 + 2) {
    ge25519_scalarmult_base_choose_niels(&t,(uint8_t (*) [96])(ulong)uVar34,(int)b[uVar35],b_00);
    ge25519_nielsadd2(r,&t);
    uVar34 = uVar34 + 1;
  }
  ge25519_double_partial(r,r);
  ge25519_double_partial(r,r);
  ge25519_double_partial(r,r);
  ge25519_double(r,r);
  ge25519_scalarmult_base_choose_niels(&t,(uint8_t (*) [96])0x0,(int)b[0],b_00);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = t.t2d[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = t.t2d[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = t.t2d[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = t.t2d[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = t.t2d[0];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = t.t2d[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = t.t2d[3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = t.t2d[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = t.t2d[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = t.t2d[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = t.t2d[4];
  local_f0 = SUB168(auVar11 * ZEXT816(0x34dca135978a3),0);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = t.t2d[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = t.t2d[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = t.t2d[3];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = t.t2d[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = t.t2d[1];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = t.t2d[4];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = t.t2d[3];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = t.t2d[2];
  auVar1 = auVar17 * ZEXT816(0x1f7afc62973807) +
           auVar19 * ZEXT816(0x8949b964e481e1) +
           auVar16 * ZEXT816(0x6164115ad394ed) + auVar1 * ZEXT816(0x34dca135978a3) +
           auVar18 * ZEXT816(0x70310d2021430b);
  uVar39 = auVar1._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = t.t2d[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = t.t2d[4];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = t.t2d[3];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = t.t2d[3];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = t.t2d[4];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = t.t2d[4];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar1._8_8_ * 0x2000 | uVar39 >> 0x33;
  auVar29 = auVar21 * ZEXT816(0x70310d2021430b) +
            auVar22 * ZEXT816(0x8949b964e481e1) +
            auVar20 * ZEXT816(0x6164115ad394ed) +
            auVar2 * ZEXT816(0x34dca135978a3) + auVar3 * ZEXT816(0x1a8283b156ebd) + auVar29;
  uVar37 = auVar29._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar29._8_8_ * 0x2000 | uVar37 >> 0x33;
  uVar37 = uVar37 & 0x7ffffffffffff;
  auVar27 = auVar5 * ZEXT816(0x5e7a26001c029) + auVar6 * ZEXT816(0x1a8283b156ebd) +
            auVar4 * ZEXT816(0x34dca135978a3) + auVar23 * ZEXT816(0x6164115ad394ed) +
            auVar24 * ZEXT816(0x8949b964e481e1) + auVar27;
  uVar35 = auVar27._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar27._8_8_ * 0x2000 | uVar35 >> 0x33;
  t.t2d[2] = uVar35 & 0x7ffffffffffff;
  auVar26 = auVar25 * ZEXT816(0x6164115ad394ed) +
            auVar9 * ZEXT816(0x1a8283b156ebd) +
            auVar8 * ZEXT816(0x739c663a03cbb) + auVar10 * ZEXT816(0x5e7a26001c029) +
            auVar7 * ZEXT816(0x34dca135978a3) + auVar26;
  uVar35 = auVar26._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar26._8_8_ << 0xd | uVar35 >> 0x33;
  t.t2d[3] = uVar35 & 0x7ffffffffffff;
  auVar28 = auVar11 * ZEXT816(0x34dca135978a3) +
            auVar12 * ZEXT816(0x52036cee2b6ff) + auVar13 * ZEXT816(0x739c663a03cbb) +
            auVar15 * ZEXT816(0x5e7a26001c029) + auVar14 * ZEXT816(0x1a8283b156ebd) + auVar28;
  uVar38 = auVar28._0_8_;
  uVar35 = (auVar28._8_8_ * 0x2000 | uVar38 >> 0x33) * 0x13 + (uVar39 & 0x7ffffffffffff);
  t.t2d[1] = (uVar35 >> 0x33) + uVar37;
  t.t2d[4] = uVar38 & 0x7ffffffffffff;
  t.t2d[0] = uVar35 & 0x7ffffffffffff;
  ge25519_nielsadd2(r,&t);
  uVar34 = 1;
  for (uVar35 = 2; uVar35 < 0x40; uVar35 = uVar35 + 2) {
    ge25519_scalarmult_base_choose_niels
              (&t,(uint8_t (*) [96])(ulong)uVar34,(int)b[uVar35],(char)uVar37);
    ge25519_nielsadd2(r,&t);
    uVar34 = uVar34 + 1;
  }
  return;
}

Assistant:

static void
ge25519_scalarmult_base_niels(ge25519 *r, const uint8_t basepoint_table[256][96], const bignum256modm s) {
	signed char b[64];
	uint32_t i;
	ge25519_niels t;

	contract256_window4_modm(b, s);

	ge25519_scalarmult_base_choose_niels(&t, basepoint_table, 0, b[1]);
	curve25519_sub_reduce(r->x, t.xaddy, t.ysubx);
	curve25519_add_reduce(r->y, t.xaddy, t.ysubx);
	memset(r->z, 0, sizeof(bignum25519));
	curve25519_copy(r->t, t.t2d);
	r->z[0] = 2;	
	for (i = 3; i < 64; i += 2) {
		ge25519_scalarmult_base_choose_niels(&t, basepoint_table, i / 2, b[i]);
		ge25519_nielsadd2(r, &t);
	}
	ge25519_double_partial(r, r);
	ge25519_double_partial(r, r);
	ge25519_double_partial(r, r);
	ge25519_double(r, r);
	ge25519_scalarmult_base_choose_niels(&t, basepoint_table, 0, b[0]);
	curve25519_mul(t.t2d, t.t2d, ge25519_ecd);
	ge25519_nielsadd2(r, &t);
	for(i = 2; i < 64; i += 2) {
		ge25519_scalarmult_base_choose_niels(&t, basepoint_table, i / 2, b[i]);
		ge25519_nielsadd2(r, &t);
	}
}